

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

string * __thiscall
Assimp::FBX::FBXConverter::NameTransformationChainNode
          (string *__return_storage_ptr__,FBXConverter *this,string *name,TransformationComp comp)

{
  long lVar1;
  long *plVar2;
  pointer *pppaVar3;
  aiMaterial **ppaVar4;
  size_type *psVar5;
  FBXConverter *this_00;
  pointer *local_90;
  pointer local_88;
  pointer local_80;
  pointer ppaStack_78;
  aiMaterial **local_70;
  pointer local_68;
  aiMaterial *local_60;
  pointer ppaStack_58;
  aiAnimation **local_50 [2];
  aiAnimation *local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"_$AssimpFbx$","");
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)local_50,0,(char *)0x0,(ulong)(name->_M_dataplus)._M_p);
  pppaVar3 = (pointer *)(plVar2 + 2);
  if ((pointer *)*plVar2 == pppaVar3) {
    local_80 = *pppaVar3;
    ppaStack_78 = (pointer)plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *pppaVar3;
    local_90 = (pointer *)*plVar2;
  }
  local_88 = (pointer)plVar2[1];
  this_00 = (FBXConverter *)&local_90;
  *plVar2 = (long)pppaVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)this_00);
  ppaVar4 = (aiMaterial **)(plVar2 + 2);
  if ((aiMaterial **)*plVar2 == ppaVar4) {
    local_60 = *ppaVar4;
    ppaStack_58 = (pointer)plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *ppaVar4;
    local_70 = (aiMaterial **)*plVar2;
  }
  local_68 = (pointer)plVar2[1];
  *plVar2 = (long)ppaVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  NameTransformationComp(this_00,comp);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::NameTransformationChainNode(const std::string& name, TransformationComp comp)
        {
            return name + std::string(MAGIC_NODE_TAG) + "_" + NameTransformationComp(comp);
        }